

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeVectorType(Builder *this,Id component,int size)

{
  int iVar1;
  Id IVar2;
  uint uVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  undefined4 in_register_00000034;
  size_t size_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  int local_2c;
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  int size_local;
  Id component_local;
  Builder *this_local;
  
  size_00 = CONCAT44(in_register_00000034,component);
  local_2c = 0;
  type._0_4_ = size;
  type._4_4_ = component;
  _size_local = this;
  do {
    iVar1 = local_2c;
    sVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x17);
    if ((int)sVar4 <= iVar1) {
      this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size_00);
      IVar2 = getUniqueId(this);
      Instruction::Instruction(this_00,IVar2,0,OpTypeVector);
      pIStack_28 = this_00;
      Instruction::addIdOperand(this_00,type._4_4_);
      Instruction::addImmediateOperand(pIStack_28,(uint)type);
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x17,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,
                 pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (local_48);
      Module::mapInstruction(&this->module,pIStack_28);
      IVar2 = Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    ppIVar5 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x17,(long)local_2c);
    pIStack_28 = *ppIVar5;
    size_00 = 0;
    IVar2 = Instruction::getIdOperand(pIStack_28,0);
    if (IVar2 == type._4_4_) {
      size_00 = 1;
      uVar3 = Instruction::getImmediateOperand(pIStack_28,1);
      if (uVar3 == (uint)type) {
        IVar2 = Instruction::getResultId(pIStack_28);
        return IVar2;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Id Builder::makeVectorType(Id component, int size)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeVector].size(); ++t) {
        type = groupedTypes[OpTypeVector][t];
        if (type->getIdOperand(0) == component &&
            type->getImmediateOperand(1) == (unsigned)size)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeVector);
    type->addIdOperand(component);
    type->addImmediateOperand(size);
    groupedTypes[OpTypeVector].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}